

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O2

void TPZShapeHDivConstantBound<pzshape::TPZShapePoint>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi)

{
  int iVar1;
  double *pdVar2;
  
  iVar1 = *(data->fSideOrient).super_TPZVec<int>.fStore;
  pdVar2 = TPZFMatrix<double>::operator()(phi,0,0);
  *pdVar2 = (double)iVar1;
  return;
}

Assistant:

void TPZShapeHDivConstantBound<class pzshape::TPZShapePoint>::Shape(const TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi) {
    phi(0,0) = data.fSideOrient[0];
}